

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restarts.cc
# Opt level: O2

void __thiscall
gss::LubyRestartsSchedule::LubyRestartsSchedule(LubyRestartsSchedule *this,longlong m)

{
  list<long_long,_std::allocator<long_long>_> *__position;
  iterator iVar1;
  longlong local_18;
  
  __position = &this->_sequence;
  (this->super_RestartsSchedule)._vptr_RestartsSchedule =
       (_func_int **)&PTR__LubyRestartsSchedule_0018c578;
  this->_backtracks_remaining = m;
  (this->_sequence).super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)__position;
  (this->_sequence).super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)__position;
  (this->_sequence).super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node._M_size
       = 0;
  (this->_current_sequence)._M_node = (_List_node_base *)0x0;
  local_18 = m;
  iVar1 = std::__cxx11::list<long_long,_std::allocator<long_long>_>::insert
                    (__position,(const_iterator)__position,&local_18);
  (this->_current_sequence)._M_node = iVar1._M_node;
  return;
}

Assistant:

LubyRestartsSchedule::LubyRestartsSchedule(long long m) :
    _backtracks_remaining(m)
{
    _current_sequence = _sequence.insert(_sequence.end(), m);
}